

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O0

int handle_ifdef(dmr_C *C,stream *stream,token **line,token *token)

{
  int iVar1;
  int local_34;
  int arg;
  token *next;
  token *token_local;
  token **line_local;
  stream *stream_local;
  dmr_C *C_local;
  
  if ((SUB84(token->next->pos,0) & 0x3f) == 2) {
    local_34 = token_defined(C,token->next);
  }
  else {
    if ((stream->dirty == 0) && (stream->dirty = 1, stream->ifndef == (token *)0x0)) {
      stream->protect = (ident *)0x0;
    }
    if (C->false_nesting == 0) {
      dmrC_sparse_error(C,token->pos,"expected preprocessor identifier");
    }
    local_34 = -1;
  }
  iVar1 = preprocessor_if(C,stream,token,local_34);
  return iVar1;
}

Assistant:

static int handle_ifdef(struct dmr_C *C, struct stream *stream, struct token **line, struct token *token)
{
	struct token *next = token->next;
	int arg;
        
        (void) line;
	if (dmrC_token_type(next) == TOKEN_IDENT) {
		arg = token_defined(C, next);
	} else {
		dirty_stream(stream);
		if (!C->false_nesting)
			dmrC_sparse_error(C, token->pos, "expected preprocessor identifier");
		arg = -1;
	}
	return preprocessor_if(C, stream, token, arg);
}